

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3StreamReader.cpp
# Opt level: O1

int __thiscall AC3StreamReader::flushPacket(AC3StreamReader *this,AVPacket *avPacket)

{
  int iVar1;
  long lVar2;
  
  iVar1 = SimplePacketizerReader::flushPacket(&this->super_SimplePacketizerReader,avPacket);
  if ((((0 < iVar1) && ((this->super_AC3Codec).m_true_hd_mode == true)) &&
      ((this->super_AC3Codec).m_downconvertToAC3 == false)) && ((avPacket->flags & 0x10) == 0)) {
    lVar2 = (this->m_totalTHDSamples * 0x13b6d8300) / (long)(this->super_AC3Codec).mlp.m_samplerate;
    avPacket->dts = lVar2;
    avPacket->pts = lVar2;
  }
  return iVar1;
}

Assistant:

int AC3StreamReader::flushPacket(AVPacket& avPacket)
{
    const int rez = SimplePacketizerReader::flushPacket(avPacket);
    if (rez > 0 && m_true_hd_mode && !m_downconvertToAC3)
    {
        if (!(avPacket.flags & AVPacket::PRIORITY_DATA))
            avPacket.pts = avPacket.dts =
                m_totalTHDSamples * INTERNAL_PTS_FREQ / mlp.m_samplerate;  // replace time to a next HD packet
    }
    return rez;
}